

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall Scene::camera(Scene *this,double x,double y,Ray *ray)

{
  int iVar1;
  Vector local_1d8;
  Vector local_1c0;
  Vector local_1a8;
  Vector local_190;
  Vector local_178;
  Vector local_160;
  Vector local_148;
  Vector local_130;
  Vector local_118;
  Vector local_100;
  Vector local_e8;
  Vector local_d0;
  Vector local_b8;
  Vector local_a0;
  Vector local_88;
  Vector local_70;
  Vector local_58;
  undefined1 local_40 [8];
  Vector lens_point;
  Ray *ray_local;
  double y_local;
  double x_local;
  Scene *this_local;
  
  lens_point.z = (double)ray;
  Vector::operator=(&ray->org,&this->eye);
  if (this->aperture <= 0.0) {
    operator*(&local_1c0,&this->view_x,x);
    operator+(&local_1a8,&this->eye_dir,&local_1c0);
    operator*(&local_1d8,&this->view_y,y);
    operator+(&local_190,&local_1a8,&local_1d8);
    normalize(&local_178,&local_190);
    Vector::operator=((Vector *)((long)lens_point.z + 0x18),&local_178);
  }
  else {
    iVar1 = rand();
    operator*(&local_88,&this->view_x,(double)iVar1);
    iVar1 = rand();
    operator*(&local_a0,&this->view_y,(double)iVar1);
    operator+(&local_70,&local_88,&local_a0);
    operator*(&local_58,&local_70,this->aperture);
    operator/((Vector *)local_40,&local_58,2147483647.0);
    Vector::operator+=((Vector *)lens_point.z,(Vector *)local_40);
    operator*(&local_100,&this->eye_dir,this->focus);
    operator*(&local_118,&this->view_x,x);
    operator+(&local_e8,&local_100,&local_118);
    operator*(&local_130,&this->view_y,y);
    operator+(&local_d0,&local_e8,&local_130);
    operator-(&local_b8,&local_d0,(Vector *)local_40);
    Vector::operator=((Vector *)((long)lens_point.z + 0x18),&local_b8);
    Vector::Vector(&local_160,(Vector *)((long)lens_point.z + 0x18));
    normalize(&local_148,&local_160);
    Vector::operator=((Vector *)((long)lens_point.z + 0x18),&local_148);
  }
  return;
}

Assistant:

void Scene::camera(double x, double y, Ray& ray)
{
    ray.org  = eye;
    if (aperture > 0.0) // камера не точечная, исп с AdaptiveDistRenderScene
    {
        // построить случайную точку на  линзе
        Vector lens_point = (view_x * (double)rand() + view_y * (double)rand()) * aperture / RAND_MAX;
        ray.org += lens_point;
        ray.dir = eye_dir * focus + view_x * x + view_y * y - lens_point;
        ray.dir = normalize(ray.dir);
    } else {
        ray.dir  = normalize(eye_dir + view_x * x + view_y * y);
    }
}